

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::ClassNamePrefix(string *classname)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  bool bVar1;
  string *in_RSI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDI;
  int i;
  string lower;
  char *in_stack_ffffffffffffff58;
  allocator *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  allocator local_6d;
  undefined4 local_6c;
  allocator local_65;
  int local_64;
  char *local_60;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  string local_30 [48];
  
  __first._M_current = in_RDI._M_current;
  std::__cxx11::string::string(local_30,in_RSI);
  local_38 = std::__cxx11::string::begin();
  local_40 = std::__cxx11::string::end();
  local_48 = std::__cxx11::string::begin();
  __result._M_current._7_1_ = in_stack_ffffffffffffff6f;
  __result._M_current._0_7_ = in_stack_ffffffffffffff68;
  local_60 = (char *)std::
                     transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                               (__first,in_RDI,__result,(_func_int_int *)in_stack_ffffffffffffff60);
  local_64 = 0;
  do {
    if (0x48 < local_64) {
      paVar2 = &local_6d;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI._M_current,"",paVar2);
      std::allocator<char>::~allocator((allocator<char> *)&local_6d);
LAB_004a2361:
      local_6c = 1;
      std::__cxx11::string::~string(local_30);
      return (string *)__first._M_current;
    }
    bVar1 = std::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (bVar1) {
      paVar2 = &local_65;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI._M_current,"PB",paVar2);
      std::allocator<char>::~allocator((allocator<char> *)&local_65);
      goto LAB_004a2361;
    }
    local_64 = local_64 + 1;
  } while( true );
}

Assistant:

std::string ClassNamePrefix(const string& classname) {
  string lower = classname;
  transform(lower.begin(), lower.end(), lower.begin(), ::tolower);

  for (int i = 0; i < kReservedNamesSize; i++) {
    if (lower == kReservedNames[i]) {
      return "PB";
    }
  }

  return "";
}